

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::anon_unknown_2::StencilOpTestCase::SetStencilOp
          (StencilOpTestCase *this,GLenum stencilOpValue)

{
  GLenum GVar1;
  GLenum stencilOpValue_local;
  StencilOpTestCase *this_local;
  
  GVar1 = this->m_stencilOpName;
  if (GVar1 == 0xb94) {
LAB_019ff6a5:
    glu::CallLogWrapper::glStencilOp
              (&(this->super_ApiCase).super_CallLogWrapper,stencilOpValue,0x1e00,0x1e00);
  }
  else {
    if (GVar1 == 0xb95) {
LAB_019ff6be:
      glu::CallLogWrapper::glStencilOp
                (&(this->super_ApiCase).super_CallLogWrapper,0x1e00,stencilOpValue,0x1e00);
      return;
    }
    if (GVar1 != 0xb96) {
      if (GVar1 == 0x8801) goto LAB_019ff6a5;
      if (GVar1 == 0x8802) goto LAB_019ff6be;
      if (GVar1 != 0x8803) {
        return;
      }
    }
    glu::CallLogWrapper::glStencilOp
              (&(this->super_ApiCase).super_CallLogWrapper,0x1e00,0x1e00,stencilOpValue);
  }
  return;
}

Assistant:

virtual void SetStencilOp (GLenum stencilOpValue)
	{
		switch (m_stencilOpName)
		{
		case GL_STENCIL_FAIL:
		case GL_STENCIL_BACK_FAIL:
			glStencilOp(stencilOpValue, GL_KEEP, GL_KEEP);
			break;

		case GL_STENCIL_PASS_DEPTH_FAIL:
		case GL_STENCIL_BACK_PASS_DEPTH_FAIL:
			glStencilOp(GL_KEEP, stencilOpValue, GL_KEEP);
			break;

		case GL_STENCIL_PASS_DEPTH_PASS:
		case GL_STENCIL_BACK_PASS_DEPTH_PASS:
			glStencilOp(GL_KEEP, GL_KEEP, stencilOpValue);
			break;

		default:
			DE_ASSERT(false && "should not happen");
			break;
		}
	}